

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

double * zernike_poly_coef(int m,int n)

{
  uint uVar1;
  double *a;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint k;
  double dVar7;
  
  uVar3 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar3 = (ulong)(n + 1U) * 8;
  }
  a = (double *)operator_new__(uVar3);
  r8vec_zero(n + 1U,a);
  if ((m <= n && -1 < (n | m)) && ((n - m & 0x80000001U) != 1)) {
    k = (uint)(m + n) >> 1;
    uVar1 = (n - m) / 2;
    uVar6 = (ulong)uVar1;
    dVar7 = r8_choose(n,k);
    a[(uint)n] = dVar7;
    lVar2 = 0;
    uVar3 = uVar6;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    iVar5 = 1;
    iVar4 = n;
    for (; uVar3 * 0x10 + lVar2 != 0; lVar2 = lVar2 + -0x10) {
      *(double *)((long)a + lVar2 + (long)n * 8 + -0x10) =
           (-(double)(int)(k * (int)uVar6) * *(double *)((long)a + lVar2 + (long)n * 8)) /
           (double)(iVar4 * iVar5);
      iVar4 = iVar4 + -1;
      k = k - 1;
      uVar6 = uVar6 - 1;
      iVar5 = iVar5 + 1;
    }
  }
  return a;
}

Assistant:

double *zernike_poly_coef ( int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    ZERNIKE_POLY_COEF: coefficients of a Zernike polynomial.
//
//  Discussion:
//
//    With our coefficients stored in C(0:N), the
//    radial function R^M_N(RHO) is given by
//
//      R^M_N(RHO) = C(0)
//                 + C(1) * RHO
//                 + C(2) * RHO^2
//                 + ...
//                 + C(N) * RHO^N
//
//    and the odd and even Zernike polynomials are
//
//      Z^M_N(RHO,PHI,odd)  = R^M_N(RHO) * sin(PHI)
//      Z^M_N(RHO,PHI,even) = R^M_N(RHO) * cos(PHI)
//
//    The first few "interesting" values of R are:
//
//    R^0_0 = 1
//
//    R^1_1 = RHO
//
//    R^0_2 = 2 * RHO^2 - 1
//    R^2_2 =     RHO^2
//
//    R^1_3 = 3 * RHO^3 - 2 * RHO
//    R^3_3 =     RHO^3
//
//    R^0_4 = 6 * RHO^4 - 6 * RHO^2 + 1
//    R^2_4 = 4 * RHO^4 - 3 * RHO^2
//    R^4_4 =     RHO^4
//
//    R^1_5 = 10 * RHO^5 - 12 * RHO^3 + 3 * RHO
//    R^3_5 =  5 * RHO^5 -  4 * RHO^3
//    R^5_5 =      RHO^5
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    02 June 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//  Parameters:
//
//    Input, int M, N, the parameters of the polynomial.
//    Normally, 0 <= M <= N and 0 <= N.
//
//    Output, double ZERNIKE_POLY_COEF[N+1], the coefficients of the polynomial.
//
{
  double *c;
  int l;
  int nm_minus;
  int nm_plus;

  c = new double[n+1];

  r8vec_zero ( n+1, c );

  if ( n < 0 )
  {
    return c;
  }

  if ( m < 0 )
  {
    return c;
  }

  if ( n < m )
  {
    return c;
  }

  if ( ( n - m ) % 2 == 1 )
  {
    return c;
  }

  nm_plus = ( m + n ) / 2;
  nm_minus = ( n - m ) / 2;

  c[n] = r8_choose ( n, nm_plus );

  for ( l = 0; l <= nm_minus - 1; l++ )
  {
    c[n-2*l-2] = - double( ( nm_plus - l ) * ( nm_minus - l ) ) 
      * c[n-2*l] / double( ( n - l ) * ( l + 1 ) );

  }

  return c;
}